

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::writeColorEndpointModes
               (AssignBlock128 *dst,deUint32 *colorEndpointModes,bool isMultiPartSingleCemMode,
               int numPartitions,int extraCemBitsStart)

{
  uint uVar1;
  uint bits;
  uint uVar2;
  uint uVar3;
  deUint32 dVar4;
  uint *puVar5;
  int local_70;
  int local_5c;
  deUint32 lowMBit1Ndx;
  deUint32 lowMBit0Ndx;
  deUint32 m;
  deUint32 c;
  int partNdx;
  deUint32 highLevelSelector;
  deUint32 maxCemClass;
  deUint32 minCemClass;
  deUint32 maxCem;
  deUint32 minCem;
  int extraCemBitsStart_local;
  int numPartitions_local;
  bool isMultiPartSingleCemMode_local;
  deUint32 *colorEndpointModes_local;
  AssignBlock128 *dst_local;
  
  if (numPartitions == 1) {
    AssignBlock128::setBits(dst,0xd,0x10,*colorEndpointModes);
  }
  else if (isMultiPartSingleCemMode) {
    AssignBlock128::setBits(dst,0x17,0x18,0);
    AssignBlock128::setBits(dst,0x19,0x1c,*colorEndpointModes);
  }
  else {
    std::min_element<unsigned_int_const*>(colorEndpointModes,colorEndpointModes + numPartitions);
    puVar5 = std::max_element<unsigned_int_const*>
                       (colorEndpointModes,colorEndpointModes + numPartitions);
    bits = de::max<unsigned_int>(1,*puVar5 >> 2);
    AssignBlock128::setBits(dst,0x17,0x18,bits);
    for (m = 0; (int)m < numPartitions; m = m + 1) {
      uVar1 = colorEndpointModes[(int)m];
      uVar2 = numPartitions + m * 2;
      local_70 = numPartitions + m * 2;
      uVar3 = local_70 + 1;
      AssignBlock128::setBit(dst,m + 0x19,(uint)(colorEndpointModes[(int)m] >> 2 == bits));
      if (uVar2 < 4) {
        local_5c = uVar2 + 0x19;
      }
      else {
        local_5c = extraCemBitsStart + uVar2 + -4;
      }
      dVar4 = getBit(uVar1 & 3,0);
      AssignBlock128::setBit(dst,local_5c,dVar4);
      if (uVar3 < 4) {
        local_70 = local_70 + 0x1a;
      }
      else {
        local_70 = extraCemBitsStart + uVar3 + -4;
      }
      dVar4 = getBit(uVar1 & 3,1);
      AssignBlock128::setBit(dst,local_70,dVar4);
    }
  }
  return;
}

Assistant:

static void writeColorEndpointModes (AssignBlock128& dst, const deUint32* colorEndpointModes, bool isMultiPartSingleCemMode, int numPartitions, int extraCemBitsStart)
{
	if (numPartitions == 1)
		dst.setBits(13, 16, colorEndpointModes[0]);
	else
	{
		if (isMultiPartSingleCemMode)
		{
			dst.setBits(23, 24, 0);
			dst.setBits(25, 28, colorEndpointModes[0]);
		}
		else
		{
			DE_ASSERT(numPartitions > 0);
			const deUint32 minCem				= *std::min_element(&colorEndpointModes[0], &colorEndpointModes[numPartitions]);
			const deUint32 maxCem				= *std::max_element(&colorEndpointModes[0], &colorEndpointModes[numPartitions]);
			const deUint32 minCemClass			= minCem/4;
			const deUint32 maxCemClass			= maxCem/4;
			DE_ASSERT(maxCemClass - minCemClass <= 1);
			DE_UNREF(minCemClass); // \note For non-debug builds.
			const deUint32 highLevelSelector	= de::max(1u, maxCemClass);

			dst.setBits(23, 24, highLevelSelector);

			for (int partNdx = 0; partNdx < numPartitions; partNdx++)
			{
				const deUint32 c			= colorEndpointModes[partNdx] / 4 == highLevelSelector ? 1 : 0;
				const deUint32 m			= colorEndpointModes[partNdx] % 4;
				const deUint32 lowMBit0Ndx	= numPartitions + 2*partNdx;
				const deUint32 lowMBit1Ndx	= numPartitions + 2*partNdx + 1;
				dst.setBit(25 + partNdx, c);
				dst.setBit(lowMBit0Ndx < 4 ? 25+lowMBit0Ndx : extraCemBitsStart+lowMBit0Ndx-4, getBit(m, 0));
				dst.setBit(lowMBit1Ndx < 4 ? 25+lowMBit1Ndx : extraCemBitsStart+lowMBit1Ndx-4, getBit(m, 1));
			}
		}
	}
}